

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_LASH(effect_handler_context_t *context)

{
  wchar_t typ;
  _Bool _Var1;
  int iVar2;
  monster *mon_00;
  monster *pmVar3;
  int iVar4;
  source origin;
  random_value_conflict dice;
  int local_54;
  wchar_t i;
  monster *t_mon;
  monster *mon;
  loc_conflict lStack_38;
  wchar_t diameter_of_source;
  loc_conflict target;
  wchar_t type;
  wchar_t flg;
  wchar_t rad;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  flg = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  mon._4_4_ = context->radius;
  loc(-1,-1);
  if ((context->origin).what == SRC_MONSTER) {
    mon_00 = (monster *)cave_monster(cave,(context->origin).which.monster);
    pmVar3 = monster_target_monster((effect_handler_context_t_conflict *)context);
    if (pmVar3 == (monster *)0x0) {
      _Var1 = monster_is_decoyed(mon_00);
      if (_Var1) {
        lStack_38 = (loc_conflict)cave_find_decoy(cave);
      }
      else {
        lStack_38.x = (player->grid).x;
        lStack_38.y = (player->grid).y;
      }
    }
    else {
      lStack_38 = pmVar3->grid;
    }
    type = mon._4_4_;
    if ((int)(uint)z_info->max_range < mon._4_4_) {
      type = (wchar_t)z_info->max_range;
    }
    typ = mon_00->race->blow->effect->lash_type;
    for (local_54 = 0; local_54 < (int)(uint)z_info->mon_blows_max; local_54 = local_54 + 1) {
      iVar2 = randcalc(mon_00->race->blow[local_54].dice,mon_00->race->level,RANDOMISE);
      iVar4 = 1;
      if (local_54 != 0) {
        iVar4 = 2;
      }
      flg = iVar2 / iVar4 + flg;
      if (mon_00->race->blow[local_54].next == (monster_blow *)0x0) break;
    }
    if (flg == L'\0') {
      context_local._7_1_ = false;
    }
    else {
      if (L'\x19' < mon._4_4_) {
        mon._4_4_ = L'\x19';
      }
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      _Var1 = project(origin,type,lStack_38,flg,typ,L'౰',L'\0',(uint8_t)mon._4_4_,context->obj);
      if (_Var1) {
        context->ident = true;
      }
      context_local._7_1_ = true;
    }
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_LASH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;

	int flg = PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL | PROJECT_ARC;
	int type;

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	/* Monsters only */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int i;

		flg |= PROJECT_PLAY;

		/* Target player or monster? */
		if (t_mon) {
			target = t_mon->grid;
		} else {
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		/* Paranoia */
		if (rad > z_info->max_range) rad = z_info->max_range;

		/* Get the type (default is PROJ_MISSILE) */
		type = mon->race->blow[0].effect->lash_type;

		/* Scan through all blows for damage */
		for (i = 0; i < z_info->mon_blows_max; i++) {
			/* Extract the attack infomation */
			random_value dice = mon->race->blow[i].dice;

			/* Full damage of first blow, plus half damage of others */
			dam += randcalc(dice, mon->race->level, RANDOMISE) / (i ? 2 : 1);
			if (!mon->race->blow[i].next) break;
		}

		/* No damaging blows */
		if (!dam) return false;
	} else {
		return false;
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Lash the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}